

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void PrintAnswerOut(fstream *fout,vector<int,_std::allocator<int>_> *answer_vector)

{
  int *piVar1;
  char cVar2;
  ostream *poVar3;
  int *piVar4;
  
  piVar4 = (answer_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (answer_vector->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar4 != piVar1) {
    do {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)(fout + 0x10),*piVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      piVar4 = piVar4 + 1;
    } while (piVar4 != piVar1);
  }
  cVar2 = (char)fout + '\x10';
  std::ios::widen((char)*(undefined8 *)(*(long *)(fout + 0x10) + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  return;
}

Assistant:

void PrintAnswerOut(std::fstream &fout, std::vector<int> &answer_vector)
{
    for (auto answer : answer_vector) {
        fout << answer << " ";
    }
    fout << std::endl;
}